

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalGenerator::AddVisibilityPresetFlags
          (cmLocalGenerator *this,string *flags,cmGeneratorTarget *target,string *lang)

{
  cmake *this_00;
  cmGeneratorTarget *pcVar1;
  bool bVar2;
  TargetType TVar3;
  PolicyStatus PVar4;
  cmValue cVar5;
  cmValue __lhs;
  string *psVar6;
  ostream *poVar7;
  string *psVar8;
  cmLocalGenerator *pcVar9;
  PolicyID id;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  pair<std::_Rb_tree_iterator<const_cmGeneratorTarget_*>,_bool> pVar10;
  cmGeneratorTarget *target_local;
  string compileOption;
  string flagDefine;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  string warnCMP0063;
  ostringstream e;
  
  if (lang->_M_string_length == 0) {
    return;
  }
  warnCMP0063._M_dataplus._M_p = (pointer)&warnCMP0063.field_2;
  warnCMP0063._M_string_length = 0;
  warnCMP0063.field_2._M_local_buf[0] = '\0';
  target_local = target;
  TVar3 = cmGeneratorTarget::GetType(target);
  if (((TVar3 == SHARED_LIBRARY) ||
      (TVar3 = cmGeneratorTarget::GetType(target_local), TVar3 == MODULE_LIBRARY)) ||
     (bVar2 = cmGeneratorTarget::IsExecutableWithExports(target_local), bVar2)) {
LAB_0021f07e:
    psVar8 = (string *)0x0;
  }
  else {
    PVar4 = cmGeneratorTarget::GetPolicyStatusCMP0063(target_local);
    if (PVar4 == OLD) goto LAB_0021f4f5;
    if (PVar4 != WARN) goto LAB_0021f07e;
    psVar8 = &warnCMP0063;
  }
  pcVar1 = target_local;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e,"CMAKE_",
                 lang);
  std::operator+(&compileOption,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e,
                 "_COMPILE_OPTIONS_VISIBILITY");
  std::__cxx11::string::~string((string *)&e);
  cVar5 = cmMakefile::GetDefinition(this->Makefile,&compileOption);
  if (cVar5.Value != (string *)0x0) {
    std::operator+(&flagDefine,lang,"_VISIBILITY_PRESET");
    __lhs = cmGeneratorTarget::GetProperty(pcVar1,&flagDefine);
    if (__lhs.Value != (string *)0x0) {
      if (psVar8 == (string *)0x0) {
        bVar2 = std::operator!=(__lhs.Value,"hidden");
        if (((bVar2) && (bVar2 = std::operator!=(__lhs.Value,"default"), bVar2)) &&
           ((bVar2 = std::operator!=(__lhs.Value,"protected"), bVar2 &&
            (bVar2 = std::operator!=(__lhs.Value,"internal"), bVar2)))) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          poVar7 = std::operator<<((ostream *)&e,"Target ");
          psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(pcVar1);
          poVar7 = std::operator<<(poVar7,(string *)psVar6);
          poVar7 = std::operator<<(poVar7," uses unsupported value \"");
          poVar7 = std::operator<<(poVar7,(string *)__lhs.Value);
          poVar7 = std::operator<<(poVar7,"\" for ");
          poVar7 = std::operator<<(poVar7,(string *)&flagDefine);
          poVar7 = std::operator<<(poVar7,".");
          std::operator<<(poVar7,
                          " The supported values are: default, hidden, protected, and internal.");
          std::__cxx11::stringbuf::str();
          cmSystemTools::Error(&local_1e8);
          std::__cxx11::string::~string((string *)&local_1e8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
          goto LAB_0021f2b6;
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e,
                       cVar5.Value,__lhs.Value);
        (*(this->super_cmOutputConverter)._vptr_cmOutputConverter[7])(this,flags,&e);
        this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e;
      }
      else {
        std::operator+(&local_1e8,"  ",&flagDefine);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e,
                       &local_1e8,"\n");
        std::__cxx11::string::append((string *)psVar8);
        std::__cxx11::string::~string((string *)&e);
        this_01 = &local_1e8;
      }
      std::__cxx11::string::~string((string *)this_01);
    }
LAB_0021f2b6:
    std::__cxx11::string::~string((string *)&flagDefine);
  }
  std::__cxx11::string::~string((string *)&compileOption);
  bVar2 = std::operator==(lang,"CXX");
  if ((bVar2) || (bVar2 = std::operator==(lang,"OBJCXX"), bVar2)) {
    pcVar1 = target_local;
    cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[43]>
              ((string *)&e,(char (*) [7])0x6cf18b,lang,
               (char (*) [43])"_COMPILE_OPTIONS_VISIBILITY_INLINES_HIDDEN");
    cVar5 = cmMakefile::GetDefinition(this->Makefile,(string *)&e);
    if (cVar5.Value != (string *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&compileOption,"VISIBILITY_INLINES_HIDDEN",(allocator<char> *)&flagDefine
                );
      bVar2 = cmGeneratorTarget::GetPropertyAsBool(pcVar1,&compileOption);
      std::__cxx11::string::~string((string *)&compileOption);
      if (bVar2) {
        if (psVar8 == (string *)0x0) {
          (*(this->super_cmOutputConverter)._vptr_cmOutputConverter[7])(this,flags,cVar5.Value);
        }
        else {
          std::__cxx11::string::append((char *)psVar8);
        }
      }
    }
    std::__cxx11::string::~string((string *)&e);
  }
  if ((warnCMP0063._M_string_length != 0) &&
     (pVar10 = std::
               _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
               ::_M_insert_unique<cmGeneratorTarget_const*const&>
                         ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                           *)&this->WarnCMP0063,&target_local),
     ((undefined1  [16])pVar10 & (undefined1  [16])0x1) != (undefined1  [16])0x0)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    cmPolicies::GetPolicyWarning_abi_cxx11_(&compileOption,(cmPolicies *)0x3f,id);
    poVar7 = std::operator<<((ostream *)&e,(string *)&compileOption);
    poVar7 = std::operator<<(poVar7,"\nTarget \"");
    psVar8 = cmGeneratorTarget::GetName_abi_cxx11_(target_local);
    poVar7 = std::operator<<(poVar7,(string *)psVar8);
    poVar7 = std::operator<<(poVar7,"\" of type \"");
    TVar3 = cmGeneratorTarget::GetType(target_local);
    psVar8 = cmState::GetTargetTypeName_abi_cxx11_(TVar3);
    poVar7 = std::operator<<(poVar7,(string *)psVar8);
    poVar7 = std::operator<<(poVar7,"\" has the following visibility properties set for ");
    poVar7 = std::operator<<(poVar7,(string *)lang);
    poVar7 = std::operator<<(poVar7,":\n");
    poVar7 = std::operator<<(poVar7,(string *)&warnCMP0063);
    std::operator<<(poVar7,"For compatibility CMake is not honoring them for this target.");
    std::__cxx11::string::~string((string *)&compileOption);
    pcVar9 = cmGeneratorTarget::GetLocalGenerator(target_local);
    this_00 = pcVar9->GlobalGenerator->CMakeInstance;
    std::__cxx11::stringbuf::str();
    cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)&flagDefine);
    cmake::IssueMessage(this_00,AUTHOR_WARNING,&compileOption,(cmListFileBacktrace *)&flagDefine);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&flagDefine._M_string_length);
    std::__cxx11::string::~string((string *)&compileOption);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
  }
LAB_0021f4f5:
  std::__cxx11::string::~string((string *)&warnCMP0063);
  return;
}

Assistant:

void cmLocalGenerator::AddVisibilityPresetFlags(
  std::string& flags, cmGeneratorTarget const* target, const std::string& lang)
{
  if (lang.empty()) {
    return;
  }

  std::string warnCMP0063;
  std::string* pWarnCMP0063 = nullptr;
  if (target->GetType() != cmStateEnums::SHARED_LIBRARY &&
      target->GetType() != cmStateEnums::MODULE_LIBRARY &&
      !target->IsExecutableWithExports()) {
    switch (target->GetPolicyStatusCMP0063()) {
      case cmPolicies::OLD:
        return;
      case cmPolicies::WARN:
        pWarnCMP0063 = &warnCMP0063;
        break;
      default:
        break;
    }
  }

  AddVisibilityCompileOption(flags, target, this, lang, pWarnCMP0063);

  if (lang == "CXX" || lang == "OBJCXX") {
    AddInlineVisibilityCompileOption(flags, target, this, pWarnCMP0063, lang);
  }

  if (!warnCMP0063.empty() && this->WarnCMP0063.insert(target).second) {
    std::ostringstream w;
    /* clang-format off */
    w <<
      cmPolicies::GetPolicyWarning(cmPolicies::CMP0063) << "\n"
      "Target \"" << target->GetName() << "\" of "
      "type \"" << cmState::GetTargetTypeName(target->GetType()) << "\" "
      "has the following visibility properties set for " << lang << ":\n" <<
      warnCMP0063 <<
      "For compatibility CMake is not honoring them for this target.";
    /* clang-format on */
    target->GetLocalGenerator()->GetCMakeInstance()->IssueMessage(
      MessageType::AUTHOR_WARNING, w.str(), target->GetBacktrace());
  }
}